

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

void r_code::Atom::Trace(Atom *base,uint16_t count)

{
  ostream *poVar1;
  ushort local_14;
  uint16_t i;
  uint16_t count_local;
  Atom *base_local;
  
  std::operator<<((ostream *)&std::cout,"--------\n");
  for (local_14 = 0; local_14 < count; local_14 = local_14 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
    std::operator<<(poVar1,"\t");
    trace(base + local_14);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Atom::Trace(Atom *base, uint16_t count)
{
    std::cout << "--------\n";

    for (uint16_t i = 0; i < count; ++i) {
        std::cout << i << "\t";
        base[i].trace();
        std::cout << std::endl;
    }
}